

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_Constractor_hex8_Test::~ConfidentialValue_Constractor_hex8_Test
          (ConfidentialValue_Constractor_hex8_Test *this)

{
  ConfidentialValue_Constractor_hex8_Test *this_local;
  
  ~ConfidentialValue_Constractor_hex8_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex8) {
  // 8byte
  ConfidentialValue value("0000000005f5e100");
  EXPECT_STREQ(value.GetHex().c_str(), "010000000005f5e100");
  EXPECT_EQ(value.GetData().GetDataSize(), 9);
  EXPECT_EQ(value.HasBlinding(), false);
  EXPECT_EQ(value.GetAmount().GetSatoshiValue(), 100000000);
}